

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

int __thiscall Buffer::Allocate(Buffer *this,string *FileName,int FileOff)

{
  bool bVar1;
  ostream *this_00;
  reference piVar2;
  reference pvVar3;
  long lVar4;
  string local_78 [32];
  const_iterator local_58;
  _List_node_base *local_50;
  _Self local_48;
  _List_node_base *local_40;
  _Self local_38;
  _List_node_base *local_30;
  _List_iterator<int> local_28;
  iterator it;
  int pos;
  int FileOff_local;
  string *FileName_local;
  Buffer *this_local;
  
  it._M_node._4_4_ = FileOff;
  bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty(&this->Empty_Block);
  if (bVar1) {
    std::_List_iterator<int>::_List_iterator(&local_28);
    local_30 = (_List_node_base *)
               std::__cxx11::list<int,_std::allocator<int>_>::begin(&this->Occupy_Block);
    local_28._M_node = local_30;
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::end(&this->Occupy_Block);
      bVar1 = std::operator!=(&local_28,&local_38);
      if ((!bVar1) ||
         (piVar2 = std::_List_iterator<int>::operator*(&local_28), this->Pin[*piVar2] == 0)) break;
      local_40 = (_List_node_base *)std::_List_iterator<int>::operator++(&local_28,0);
    }
    local_48._M_node =
         (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(&this->Occupy_Block);
    bVar1 = std::operator==(&local_28,&local_48);
    if (bVar1) {
      this_00 = std::operator<<((ostream *)&std::cout,"Blocks are not enough!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      system("pause");
      exit(1);
    }
    piVar2 = std::_List_iterator<int>::operator*(&local_28);
    if (this->Dirty[*piVar2] == 1) {
      piVar2 = std::_List_iterator<int>::operator*(&local_28);
      Block::WriteFile(this->buffer + *piVar2);
    }
    piVar2 = std::_List_iterator<int>::operator*(&local_28);
    it._M_node._0_4_ = *piVar2;
    std::_List_const_iterator<int>::_List_const_iterator(&local_58,&local_28);
    local_50 = (_List_node_base *)
               std::__cxx11::list<int,_std::allocator<int>_>::erase(&this->Occupy_Block,local_58);
    local_28._M_node = local_50;
  }
  else {
    pvVar3 = std::__cxx11::list<int,_std::allocator<int>_>::front(&this->Empty_Block);
    it._M_node._0_4_ = *pvVar3;
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front(&this->Empty_Block);
  }
  Block::BlockClear(this->buffer + (value_type)it._M_node);
  lVar4 = (long)(value_type)it._M_node;
  std::__cxx11::string::string(local_78,(string *)FileName);
  Block::BlockSet(this->buffer + lVar4,(string *)local_78,it._M_node._4_4_);
  std::__cxx11::string::~string(local_78);
  Block::ReadFile(this->buffer + (value_type)it._M_node);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back
            (&this->Occupy_Block,(value_type_conflict *)&it);
  UnDirt(this,(value_type)it._M_node);
  Lock(this,(value_type)it._M_node);
  return (value_type)it._M_node;
}

Assistant:

int Buffer::Allocate(string FileName, int FileOff) {
	int pos;
	if (this->Empty_Block.empty()) {
		//û�пտ飬ֻ�ܸ���LRUԭ���滻
		list<int>::iterator it;
		for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
			if (Pin[*it] == 0)	break;				//�ҵ���Զ�޸���û�������Ŀ�
		}
		if (it == this->Occupy_Block.end()) {
			cout << "Blocks are not enough!" << endl;
			system("pause");
			exit(1);
		}
		if (Dirty[*it] == 1) {
			this->buffer[*it].WriteFile();			//���޸ģ���д�ش���
		}
		pos = *it;
		it = this->Occupy_Block.erase(it);
	}
	else {
		//���пտ飬ȡ������
		pos = this->Empty_Block.front();
		this->Empty_Block.pop_front();
	}
	this->buffer[pos].BlockClear();					//��ոÿ�
	this->buffer[pos].BlockSet(FileName, FileOff);
	this->buffer[pos].ReadFile();
	this->Occupy_Block.push_back(pos);
	this->UnDirt(pos);
	this->Lock(pos);							//����������һ�θ��µ���֮ǰ���ñ��滻��ȥ
	return pos;
}